

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void ipred_dc(pel *src,pel *dst,int i_dst,int w,int h,u16 avail_cu,int bit_depth)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((avail_cu & 2) == 0) {
    if ((avail_cu & 1) == 0) {
      uVar1 = 1 << ((char)bit_depth - 1U & 0x1f);
    }
    else {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < w) {
        uVar5 = (ulong)(uint)w;
      }
      iVar2 = 0;
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        iVar2 = iVar2 + (uint)src[uVar4 + 1];
      }
      uVar1 = iVar2 + (w >> 1) >> (g_tbl_log2[w] & 0x1fU);
    }
  }
  else {
    lVar3 = 0;
    uVar4 = 0;
    if (0 < h) {
      uVar4 = (ulong)(uint)h;
    }
    iVar2 = 0;
    for (; -lVar3 != uVar4; lVar3 = lVar3 + -1) {
      iVar2 = iVar2 + (uint)src[lVar3 + -1];
    }
    if ((avail_cu & 1) == 0) {
      uVar1 = iVar2 + (h >> 1) >> (g_tbl_log2[h] & 0x1fU);
    }
    else {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < w) {
        uVar5 = (ulong)(uint)w;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        iVar2 = iVar2 + (uint)src[uVar4 + 1];
      }
      uVar1 = (int)(0x1000 / (long)(w + h)) * (iVar2 + (w + h >> 1)) >> 0xc;
    }
  }
  while (bVar6 = h != 0, h = h + -1, bVar6) {
    memset(dst,uVar1 & 0xff,(long)w);
    dst = dst + i_dst;
  }
  return;
}

Assistant:

void ipred_dc(pel *src, pel *dst, int i_dst, int w, int h, u16 avail_cu, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int dc = 0;
    int i, j;
    if(IS_AVAIL(avail_cu, AVAIL_LE)) {
        for (i = 0; i < h; i++) {
            dc += src[-i-1];
        }
        if(IS_AVAIL(avail_cu, AVAIL_UP)) {
            for (j = 0; j < w; j++) {
                dc += src[j+1];
            }
            dc = (dc + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
        } else {
            dc = (dc + (h >> 1)) >> g_tbl_log2[h];
        }
    } else if(IS_AVAIL(avail_cu, AVAIL_UP)) {
        for (j = 0; j < w; j++) {
            dc += src[j+1];
        }
        dc = (dc + (w >> 1)) >> g_tbl_log2[w];
    } else {     
        dc = 1 << (bit_depth - 1);
    }

    while(h--) {
        com_mset_pel(dst, dc, w);
        dst += i_dst;
    }
}